

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::StdString::RegexMatcher::describe_abi_cxx11_(RegexMatcher *this)

{
  string *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *__lhs;
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RDI;
  Detail::stringify<std::__cxx11::string>(in_stack_ffffffffffffff68);
  std::operator+((char *)__lhs,in_stack_ffffffffffffff70);
  std::operator+(__lhs,(char *)in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string RegexMatcher::describe() const {
            return "matches " + ::Catch::Detail::stringify(m_regex) + ((m_caseSensitivity == CaseSensitive::Choice::Yes)? " case sensitively" : " case insensitively");
        }